

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.h
# Opt level: O0

cmplx __thiscall klogic::mvn::output(mvn *this,cvector *X)

{
  int k;
  const_iterator Xbeg;
  const_iterator Xend;
  cmplx cVar1;
  cmplx local_38;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *local_28;
  cvector *X_local;
  mvn *this_local;
  
  k = this->k;
  local_28 = X;
  X_local = &this->weights;
  Xbeg = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin(X);
  Xend = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end(local_28);
  weighted_sum(this,Xbeg,Xend);
  cVar1 = activation(k,&local_38);
  return (cmplx)cVar1._M_value;
}

Assistant:

cmplx output(const cvector &X) const {
            return activation(k, weighted_sum(X.begin(), X.end()));
        }